

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::validate(MoleculeStamp *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar7;
  MoleculeStamp *pMVar8;
  MoleculeStamp *in_RDI;
  RigidBodyStamp *rbStamp_1;
  size_t i_2;
  size_t nrigidAtoms;
  iterator j;
  vector<int,_std::allocator<int>_> members;
  RigidBodyStamp *rbStamp;
  size_t i_1;
  uint i;
  DataHolder *in_stack_00000150;
  MoleculeStamp *in_stack_00000190;
  MoleculeStamp *in_stack_00000260;
  MoleculeStamp *in_stack_00000280;
  MoleculeStamp *in_stack_00000400;
  MoleculeStamp *in_stack_00000720;
  MoleculeStamp *in_stack_00000890;
  MoleculeStamp *in_stack_000009e0;
  RigidBodyStamp *in_stack_ffffffffffffff58;
  MoleculeStamp *in_stack_ffffffffffffff60;
  MoleculeStamp *this_01;
  undefined4 in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff74;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  MoleculeStamp *local_58;
  long local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40 [4];
  RigidBodyStamp *local_20;
  ulong local_18;
  uint local_c;
  
  DataHolder::validate(in_stack_00000150);
  getNAtoms((MoleculeStamp *)0x323369);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  local_c = 0;
  while( true ) {
    uVar3 = (ulong)local_c;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->atom2Rigidbody);
    if (sVar4 <= uVar3) break;
    iVar2 = -1 - local_c;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->atom2Rigidbody,(ulong)local_c);
    *pvVar5 = iVar2;
    local_c = local_c + 1;
  }
  local_18 = 0;
  while( true ) {
    uVar3 = local_18;
    sVar6 = getNRigidBodies((MoleculeStamp *)0x323411);
    if (sVar6 <= uVar3) break;
    local_20 = getRigidBodyStamp(in_stack_ffffffffffffff60,
                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    RigidBodyStamp::getMembers(in_stack_ffffffffffffff58);
    local_40[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff58);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff60,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff58);
      if (!bVar1) break;
      in_stack_ffffffffffffff74 = (value_type)local_18;
      this_00 = &in_RDI->atom2Rigidbody;
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_40);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*piVar7);
      *pvVar5 = in_stack_ffffffffffffff74;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_40);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_18 = local_18 + 1;
  }
  checkAtoms(in_stack_00000190);
  checkBonds(in_stack_00000400);
  fillBondInfo(in_RDI);
  checkBends(in_stack_000009e0);
  checkTorsions(in_stack_00000720);
  checkInversions(in_stack_00000890);
  checkRigidBodies(in_stack_00000280);
  checkCutoffGroups(in_stack_00000260);
  checkFragments(in_stack_00000190);
  checkConstraints(in_stack_00000400);
  local_50 = 0;
  local_58 = (MoleculeStamp *)0x0;
  while( true ) {
    this_01 = local_58;
    pMVar8 = (MoleculeStamp *)getNRigidBodies((MoleculeStamp *)0x323575);
    if (pMVar8 <= this_01) break;
    getRigidBodyStamp(this_01,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    sVar6 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x3235a2);
    local_50 = sVar6 + local_50;
    local_58 = (MoleculeStamp *)((long)&(local_58->super_DataHolder)._vptr_DataHolder + 1);
  }
  sVar6 = getNAtoms((MoleculeStamp *)0x3235c6);
  iVar2 = (int)sVar6;
  sVar6 = getNRigidBodies((MoleculeStamp *)0x3235d4);
  in_RDI->nintegrable_ = (iVar2 + (int)sVar6) - (int)local_50;
  return;
}

Assistant:

void MoleculeStamp::validate() {
    DataHolder::validate();

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }

    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkFragments();
    checkConstraints();

    size_t nrigidAtoms = 0;
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp = getRigidBodyStamp(i);
      nrigidAtoms += rbStamp->getNMembers();
    }
    nintegrable_ = getNAtoms() + getNRigidBodies() - nrigidAtoms;
  }